

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * gpt_random_prompt_abi_cxx11_(string *__return_storage_ptr__,mt19937 *rng)

{
  result_type_conflict rVar1;
  string *psVar2;
  
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(rng);
  psVar2 = (string *)(*(code *)(&DAT_00173d38 + *(int *)(&DAT_00173d38 + (rVar1 % 10) * 4)))();
  return psVar2;
}

Assistant:

std::string gpt_random_prompt(std::mt19937 & rng) {
    const int r = rng() % 10;
    switch (r) {
        case 0: return "So";
        case 1: return "Once upon a time";
        case 2: return "When";
        case 3: return "The";
        case 4: return "After";
        case 5: return "If";
        case 6: return "import";
        case 7: return "He";
        case 8: return "She";
        case 9: return "They";
    }

    return "The";
}